

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TextTrieMap::putImpl(TextTrieMap *this,UnicodeString *key,void *value,UErrorCode *status)

{
  CharacterNode *pCVar1;
  UnicodeString *this_00;
  int local_94;
  CharacterNode *pCStack_90;
  int32_t index;
  CharacterNode *node;
  int local_74;
  char16_t *pcStack_70;
  int32_t keyLength;
  UChar *keyBuffer;
  UnicodeString foldedKey;
  UErrorCode *status_local;
  void *value_local;
  UnicodeString *key_local;
  TextTrieMap *this_local;
  
  foldedKey.fUnion._48_8_ = status;
  if (this->fNodes == (CharacterNode *)0x0) {
    this->fNodesCapacity = 0x200;
    pCVar1 = (CharacterNode *)uprv_malloc_63((long)this->fNodesCapacity << 4);
    this->fNodes = pCVar1;
    if (this->fNodes == (CharacterNode *)0x0) {
      *(undefined4 *)foldedKey.fUnion._48_8_ = 7;
      return;
    }
    CharacterNode::clear(this->fNodes);
    this->fNodesCount = 1;
  }
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&keyBuffer);
  if (this->fIgnoreCase == '\0') {
    pcStack_70 = icu_63::UnicodeString::getBuffer(key);
    local_74 = icu_63::UnicodeString::length(key);
  }
  else {
    this_00 = icu_63::UnicodeString::fastCopyFrom((UnicodeString *)&keyBuffer,key);
    icu_63::UnicodeString::foldCase(this_00,0);
    pcStack_70 = icu_63::UnicodeString::getBuffer((UnicodeString *)&keyBuffer);
    local_74 = icu_63::UnicodeString::length((UnicodeString *)&keyBuffer);
  }
  pCStack_90 = this->fNodes;
  for (local_94 = 0; local_94 < local_74; local_94 = local_94 + 1) {
    pCStack_90 = addChildNode(this,pCStack_90,pcStack_70[local_94],
                              (UErrorCode *)foldedKey.fUnion._48_8_);
  }
  CharacterNode::addValue
            (pCStack_90,value,this->fValueDeleter,(UErrorCode *)foldedKey.fUnion._48_8_);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&keyBuffer);
  return;
}

Assistant:

void
TextTrieMap::putImpl(const UnicodeString &key, void *value, UErrorCode &status) {
    if (fNodes == NULL) {
        fNodesCapacity = 512;
        fNodes = (CharacterNode *)uprv_malloc(fNodesCapacity * sizeof(CharacterNode));
        if (fNodes == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        fNodes[0].clear();  // Init root node.
        fNodesCount = 1;
    }

    UnicodeString foldedKey;
    const UChar *keyBuffer;
    int32_t keyLength;
    if (fIgnoreCase) {
        // Ok to use fastCopyFrom() because we discard the copy when we return.
        foldedKey.fastCopyFrom(key).foldCase();
        keyBuffer = foldedKey.getBuffer();
        keyLength = foldedKey.length();
    } else {
        keyBuffer = key.getBuffer();
        keyLength = key.length();
    }

    CharacterNode *node = fNodes;
    int32_t index;
    for (index = 0; index < keyLength; ++index) {
        node = addChildNode(node, keyBuffer[index], status);
    }
    node->addValue(value, fValueDeleter, status);
}